

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonObject *o)

{
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborMap *in_stack_ffffffffffffffc8;
  QJsonObject local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCborMap::fromJsonObject(&local_10);
  QCborValue::QCborValue(in_RDI,in_stack_ffffffffffffffc8);
  QCborMap::~QCborMap((QCborMap *)0x1bce37);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(const QJsonObject &o)
    : value(QCborMap::fromJsonObject(o))
{
}